

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

void __thiscall
pbrt::UniformGridMediumProvider::UniformGridMediumProvider
          (UniformGridMediumProvider *this,Bounds3f *bounds,
          optional<pbrt::SampledGrid<float>_> *dgrid,
          optional<pbrt::SampledGrid<pbrt::RGB>_> *rgbgrid,RGBColorSpace *colorSpace,
          SpectrumHandle *Le,SampledGrid<float> *Legrid,Allocator alloc)

{
  undefined8 uVar1;
  Allocator alloc_00;
  bool bVar2;
  size_t sVar3;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  long *in_FS_OFFSET;
  SampledGrid<float> *in_stack_ffffffffffffff28;
  SampledGrid<float> *in_stack_ffffffffffffff30;
  optional<pbrt::SampledGrid<pbrt::RGB>_> *in_stack_ffffffffffffff38;
  optional<pbrt::SampledGrid<pbrt::RGB>_> *in_stack_ffffffffffffff40;
  DenselySampledSpectrum *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  
  in_RDI[2] = in_RSI[2];
  uVar1 = in_RSI[1];
  *in_RDI = *in_RSI;
  in_RDI[1] = uVar1;
  pstd::optional<pbrt::SampledGrid<float>_>::optional
            ((optional<pbrt::SampledGrid<float>_> *)in_stack_ffffffffffffff40,
             (optional<pbrt::SampledGrid<float>_> *)in_stack_ffffffffffffff38);
  pstd::optional<pbrt::SampledGrid<pbrt::RGB>_>::optional
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  in_RDI[0x11] = in_R8;
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)in_stack_ffffffffffffff30,(SpectrumHandle *)in_stack_ffffffffffffff28
            );
  alloc_00.memoryResource._7_1_ = in_stack_ffffffffffffff57;
  alloc_00.memoryResource._0_7_ = in_stack_ffffffffffffff50;
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_ffffffffffffff48,(SpectrumHandle *)in_stack_ffffffffffffff40,alloc_00);
  SampledGrid<float>::SampledGrid(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  sVar3 = SampledGrid<float>::BytesAllocated((SampledGrid<float> *)0x72efd5);
  in_FS_OFFSET[-0x6c] = in_FS_OFFSET[-0x6c] + sVar3;
  bVar2 = pstd::optional::operator_cast_to_bool((optional *)(in_RDI + 3));
  if (bVar2) {
    pstd::optional<pbrt::SampledGrid<float>_>::operator->
              ((optional<pbrt::SampledGrid<float>_> *)0x72f022);
    sVar3 = SampledGrid<float>::BytesAllocated((SampledGrid<float> *)0x72f033);
  }
  else {
    pstd::optional<pbrt::SampledGrid<pbrt::RGB>_>::operator->
              ((optional<pbrt::SampledGrid<pbrt::RGB>_> *)0x72f054);
    sVar3 = SampledGrid<pbrt::RGB>::BytesAllocated((SampledGrid<pbrt::RGB> *)0x72f065);
  }
  *(long *)(*in_FS_OFFSET + -0x360) = sVar3 + *(long *)(*in_FS_OFFSET + -0x360);
  return;
}

Assistant:

UniformGridMediumProvider::UniformGridMediumProvider(
    const Bounds3f &bounds, pstd::optional<SampledGrid<Float>> dgrid,
    pstd::optional<SampledGrid<RGB>> rgbgrid, const RGBColorSpace *colorSpace,
    SpectrumHandle Le, SampledGrid<Float> Legrid, Allocator alloc)
    : bounds(bounds),
      densityGrid(std::move(dgrid)),
      rgbDensityGrid(std::move(rgbgrid)),
      colorSpace(colorSpace),
      Le_spec(Le, alloc),
      LeScaleGrid(std::move(Legrid)) {
    volumeGridBytes += LeScaleGrid.BytesAllocated();
    volumeGridBytes +=
        densityGrid ? densityGrid->BytesAllocated() : rgbDensityGrid->BytesAllocated();
}